

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O2

Image * ImageFromImage(Image *__return_storage_ptr__,Image image,Rectangle rec)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  int iVar4;
  int iVar5;
  void *__src;
  float fVar6;
  float local_78;
  float local_48;
  float fStack_44;
  
  fVar6 = rec.height;
  iVar1 = GetPixelDataSize(1,1,image.format);
  local_78 = rec.width;
  __return_storage_ptr__->width = (int)local_78;
  __return_storage_ptr__->height = (int)fVar6;
  pvVar3 = calloc((long)((int)(fVar6 * local_78) * iVar1),1);
  __return_storage_ptr__->data = pvVar3;
  __return_storage_ptr__->format = image.format;
  __return_storage_ptr__->mipmaps = 1;
  iVar2 = (int)local_78 * iVar1;
  local_48 = rec.x;
  fStack_44 = rec.y;
  __src = (void *)(((long)(int)fStack_44 * (long)image.width + (long)(int)local_48) * (long)iVar1 +
                  (long)image.data);
  iVar4 = 0;
  for (iVar5 = 0; (float)iVar5 < fVar6; iVar5 = iVar5 + 1) {
    memcpy((void *)((long)pvVar3 + (long)iVar4),__src,(long)iVar2);
    iVar4 = iVar4 + iVar2;
    __src = (void *)((long)__src + (long)iVar1 * (long)image.width);
  }
  return __return_storage_ptr__;
}

Assistant:

Image ImageFromImage(Image image, Rectangle rec)
{
    Image result = { 0 };

    int bytesPerPixel = GetPixelDataSize(1, 1, image.format);

    // TODO: Check rec is valid?

    result.width = (int)rec.width;
    result.height = (int)rec.height;
    result.data = RL_CALLOC((int)(rec.width*rec.height)*bytesPerPixel, 1);
    result.format = image.format;
    result.mipmaps = 1;

    for (int y = 0; y < rec.height; y++)
    {
        memcpy(((unsigned char *)result.data) + y*(int)rec.width*bytesPerPixel, ((unsigned char *)image.data) + ((y + (int)rec.y)*image.width + (int)rec.x)*bytesPerPixel, (int)rec.width*bytesPerPixel);
    }

    return result;
}